

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O3

DWORD CorUnix::InternalWaitForMultipleObjectsEx
                (CPalThread *pThread,DWORD nCount,HANDLE *lpHandles,BOOL bWaitAll,
                DWORD dwMilliseconds,BOOL bAlertable)

{
  size_t szSize;
  ulong uVar1;
  BOOL BVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ulong *puVar7;
  ulong *puVar8;
  DWORD DVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  IPalObject **__s;
  ulong uStack_188;
  IPalObject *pIPalObjStackArray [16];
  ISynchWaitController *pISyncStackArray [16];
  uint local_64;
  BOOL local_60;
  bool fValue;
  ulong local_58;
  uint local_4c;
  uint local_48;
  int iSignaledObjIndex;
  undefined4 local_40;
  byte local_39;
  IPalObject **ppIStack_38;
  bool fAbandoned;
  ulong uVar9;
  
  uVar1 = (ulong)nCount;
  local_4c = 0xffffffff;
  local_39 = 0;
  pIPalObjStackArray[0xd] = (IPalObject *)0x0;
  pIPalObjStackArray[0xe] = (IPalObject *)0x0;
  pIPalObjStackArray[0xb] = (IPalObject *)0x0;
  pIPalObjStackArray[0xc] = (IPalObject *)0x0;
  pIPalObjStackArray[9] = (IPalObject *)0x0;
  pIPalObjStackArray[10] = (IPalObject *)0x0;
  pIPalObjStackArray[7] = (IPalObject *)0x0;
  pIPalObjStackArray[8] = (IPalObject *)0x0;
  pIPalObjStackArray[5] = (IPalObject *)0x0;
  pIPalObjStackArray[6] = (IPalObject *)0x0;
  pIPalObjStackArray[3] = (IPalObject *)0x0;
  pIPalObjStackArray[4] = (IPalObject *)0x0;
  pIPalObjStackArray[1] = (IPalObject *)0x0;
  pIPalObjStackArray[2] = (IPalObject *)0x0;
  uStack_188 = 0;
  pIPalObjStackArray[0] = (IPalObject *)0x0;
  pIPalObjStackArray[0xf] = (IPalObject *)0x0;
  if (nCount - 0x41 < 0xffffffc0) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_002cb96a;
    piVar6 = __errno_location();
    *piVar6 = 0x57;
    DVar10 = 0xffffffff;
    puVar7 = (ulong *)0x0;
    __s = (IPalObject **)0x0;
    goto LAB_002cb3f6;
  }
  __s = pIPalObjStackArray + 0xf;
  puVar7 = &uStack_188;
  local_60 = bAlertable;
  _fValue = dwMilliseconds;
  if (nCount != 1) {
    local_40 = (undefined4)CONCAT71((int7)((ulong)lpHandles >> 8),bWaitAll != 0);
    ppIStack_38 = (IPalObject **)CONCAT44(ppIStack_38._4_4_,2 - (uint)(bWaitAll == 0));
    if (nCount < 0x11) goto LAB_002cb279;
    szSize = uVar1 * 8 + 8;
    puVar7 = (ulong *)InternalMalloc(szSize);
    if (puVar7 == (ulong *)0x0) {
      puVar7 = (ulong *)0x0;
    }
    else {
      *puVar7 = uVar1;
      puVar7 = puVar7 + 1;
      memset(puVar7,0,uVar1 * 8);
    }
    puVar8 = (ulong *)InternalMalloc(szSize);
    if (puVar8 == (ulong *)0x0) {
      __s = (IPalObject **)0x0;
    }
    else {
      *puVar8 = uVar1;
      __s = (IPalObject **)(puVar8 + 1);
      local_48 = CONCAT31(local_48._1_3_,__s != (IPalObject **)0x0);
      memset(__s,0,uVar1 * 8);
      if (((byte)local_48 & puVar7 != (ulong *)0x0) != 0) goto LAB_002cb279;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
    piVar6 = __errno_location();
    *piVar6 = 8;
    DVar10 = 0xffffffff;
    goto LAB_002cb3fb;
  }
  ppIStack_38 = (IPalObject **)((ulong)ppIStack_38._4_4_ << 0x20);
  local_40 = 0;
LAB_002cb279:
  iVar4 = (**(code **)(*g_pObjectManager + 0x30))
                    (g_pObjectManager,pThread,lpHandles,uVar1,&sg_aotWaitObject,0x100000,puVar7);
  if (iVar4 != 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
    piVar6 = __errno_location();
    if (iVar4 == 6) {
      *piVar6 = 6;
    }
    else {
      *piVar6 = 0x54f;
    }
    DVar10 = 0xffffffff;
    goto LAB_002cb3f6;
  }
  if (((char)local_40 != '\0') && (nCount - 1 != 0)) {
    uVar11 = uVar1;
    puVar8 = puVar7;
    uVar9 = 0;
    do {
      uVar13 = uVar9 + 1;
      if (uVar13 < uVar1) {
        uVar14 = 1;
        do {
          if (puVar8[uVar14] == puVar7[uVar9]) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
            piVar6 = __errno_location();
            *piVar6 = 0x57;
            goto LAB_002cb3c1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      puVar8 = puVar8 + 1;
      uVar11 = uVar11 - 1;
      uVar9 = uVar13;
    } while (uVar13 != nCount - 1);
  }
  iVar4 = (**(code **)(*g_pSynchronizationManager + 0x28))
                    (g_pSynchronizationManager,pThread,puVar7,uVar1,__s);
  if (iVar4 != 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
    goto LAB_002cb365;
  }
  if ((local_60 != 0) &&
     (cVar3 = (**(code **)(*g_pSynchronizationManager + 0x18))(g_pSynchronizationManager,pThread),
     cVar3 != '\0')) {
    if (0 < (int)nCount) {
      uVar11 = 0;
      do {
        if (__s[uVar11] == (IPalObject *)0x0) break;
        (*__s[uVar11]->_vptr_IPalObject[3])();
        __s[uVar11] = (IPalObject *)0x0;
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    iVar4 = (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread);
    if (iVar4 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,400);
      fprintf(_stderr,"Awakened for APC, but no APC is pending\n");
      goto LAB_002cb365;
    }
    ppIStack_38 = (IPalObject **)0xc0;
    goto LAB_002cb3c6;
  }
  local_4c = 0xffffffff;
  if (0 < (int)nCount) {
    uVar11 = 0;
    local_58 = 0xffffffff;
    local_48 = 0;
    do {
      uVar5 = (**__s[uVar11]->_vptr_IPalObject)(__s[uVar11],&local_64,&local_39);
      uVar9 = (ulong)uVar5;
      if (uVar5 != 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
        piVar6 = __errno_location();
        *piVar6 = 0x54f;
        goto LAB_002cb578;
      }
      bVar12 = (byte)local_40;
      if ((char)local_64 == '\x01') {
        local_48 = local_48 + 1;
        local_4c = (uint)uVar11;
        if (bVar12 == 0) {
          local_58 = uVar11;
          break;
        }
        uVar9 = uVar11 & 0xffffffff;
        local_58 = uVar9;
      }
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
    if (((int)local_48 < (int)nCount & bVar12) == 0 && local_48 != 0) {
      uVar5 = 0;
      if (bVar12 == 0) {
        uVar5 = (uint)local_58;
      }
      DVar10 = (uint)local_58 + 1;
      if (bVar12 != 0) {
        DVar10 = nCount;
      }
      if (-1 < (int)uVar5) {
        if ((int)uVar5 < (int)DVar10) {
          ppIStack_38 = __s + uVar5;
          lVar15 = 0;
LAB_002cb637:
          iVar4 = (*ppIStack_38[lVar15]->_vptr_IPalObject[1])();
          if (iVar4 == 0) goto code_r0x002cb650;
          if (PAL_InitializeChakraCoreCalled != false) {
            piVar6 = __errno_location();
            *piVar6 = iVar4;
LAB_002cb578:
            ppIStack_38 = (IPalObject **)0xffffffff;
            local_58 = local_58 & 0xffffffff00000000;
            goto LAB_002cb67b;
          }
          goto LAB_002cb96a;
        }
LAB_002cb65b:
        ppIStack_38 = (IPalObject **)((ulong)local_39 << 7);
        local_58 = CONCAT44(local_58._4_4_,(int)CONCAT71((int7)(((ulong)local_39 << 7) >> 8),1));
        goto LAB_002cb67b;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
      piVar6 = __errno_location();
      *piVar6 = 0x54f;
      ppIStack_38 = (IPalObject **)0xffffffff;
    }
    else {
      if (_fValue == 0) {
        local_58 = CONCAT44(local_58._4_4_,(int)CONCAT71((int7)(uVar9 >> 8),1));
        ppIStack_38 = (IPalObject **)0x102;
LAB_002cb67b:
        iSignaledObjIndex = 0;
      }
      else {
        if ((int)nCount < 1) {
          ppIStack_38 = (IPalObject **)0xffffffff;
          goto LAB_002cb70a;
        }
        uVar11 = 0;
        do {
          iVar4 = (*__s[uVar11]->_vptr_IPalObject[2])
                            (__s[uVar11],(ulong)ppIStack_38 & 0xffffffff,uVar11 & 0xffffffff,
                             (ulong)(local_60 == 1));
          if (iVar4 != 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
            piVar6 = __errno_location();
            *piVar6 = iVar4;
            iSignaledObjIndex = (int)CONCAT71((int7)((ulong)piVar6 >> 8),1);
            ppIStack_38 = (IPalObject **)0xffffffff;
            local_58 = local_58 & 0xffffffff00000000;
            goto LAB_002cb682;
          }
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
        local_58 = CONCAT44(local_58._4_4_,1);
        ppIStack_38 = (IPalObject **)0xffffffff;
        iSignaledObjIndex = -0xff;
      }
LAB_002cb682:
      if (0 < (int)nCount) {
        uVar11 = 0;
        do {
          (*__s[uVar11]->_vptr_IPalObject[3])();
          __s[uVar11] = (IPalObject *)0x0;
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      if ((char)local_58 != '\0') {
        if ((char)iSignaledObjIndex != '\0') goto LAB_002cb70a;
        goto LAB_002cb88b;
      }
    }
    goto LAB_002cb3ca;
  }
  if (_fValue == 0) {
    DVar10 = 0x102;
    goto LAB_002cb3f6;
  }
  ppIStack_38 = (IPalObject **)0xffffffff;
  local_48 = 0;
LAB_002cb70a:
  BVar2 = local_60;
  iVar4 = (**(code **)*g_pSynchronizationManager)
                    (g_pSynchronizationManager,pThread,_fValue,local_60 == 1,0,&local_64,&local_4c);
  if (iVar4 != 0) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_002cb96a:
      abort();
    }
    piVar6 = __errno_location();
    *piVar6 = iVar4;
    goto LAB_002cb3ca;
  }
  switch((IPalObject **)(ulong)local_64) {
  case (IPalObject **)0x0:
    ppIStack_38 = (IPalObject **)(ulong)local_64;
    break;
  case (IPalObject **)0x1:
    if (BVar2 == 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x21e);
      fprintf(_stderr,
              "Expression: bAlertable, Description: Awakened for APC from a non-alertable wait\n");
    }
    iVar4 = (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread);
    ppIStack_38 = (IPalObject **)0xc0;
    if (iVar4 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x224);
      fprintf(_stderr,
              "Expression: NO_ERROR == palErr, Description: Awakened for APC, but no APC is pending\n"
             );
    }
    break;
  case (IPalObject **)0x2:
    ppIStack_38 = (IPalObject **)0x80;
    goto LAB_002cb7c2;
  case (IPalObject **)0x3:
    ppIStack_38 = (IPalObject **)0x102;
LAB_002cb7c2:
    break;
  default:
    ppIStack_38 = (IPalObject **)0xffffffff;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cb96a;
  }
LAB_002cb88b:
  if ((char)local_40 == '\0' && ((ulong)ppIStack_38 & 0xffffff7f) == 0) {
    if ((int)local_4c < 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x231);
      fprintf(_stderr,
              "Expression: 0 <= iSignaledObjIndex, Description: Failed to identify signaled/abandoned object\n"
             );
    }
    if ((int)local_4c < 0 || nCount <= local_4c) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x235);
      fprintf(_stderr,
              "Expression: iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex), Description: SignaledObjIndex object out of range [index=%d obj_count=%u\n"
              ,(ulong)local_48,uVar1);
      if ((int)local_4c < 0) {
LAB_002cb365:
        piVar6 = __errno_location();
        *piVar6 = 0x54f;
LAB_002cb3c1:
        ppIStack_38 = (IPalObject **)0xffffffff;
LAB_002cb3c6:
        goto LAB_002cb3ca;
      }
    }
    ppIStack_38 = (IPalObject **)(ulong)((int)ppIStack_38 + local_4c);
  }
LAB_002cb3ca:
  if (0 < (int)nCount) {
    uVar11 = 0;
    do {
      (**(code **)(*(long *)puVar7[uVar11] + 0x40))((long *)puVar7[uVar11],pThread);
      puVar7[uVar11] = 0;
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  DVar10 = (DWORD)ppIStack_38;
LAB_002cb3f6:
  if (0x10 < nCount) {
LAB_002cb3fb:
    if (puVar7 != (ulong *)0x0) {
      InternalFree(puVar7 + -1);
    }
    if (__s != (IPalObject **)0x0) {
      InternalFree(__s + -1);
    }
  }
  return DVar10;
code_r0x002cb650:
  lVar15 = lVar15 + 1;
  if (DVar10 - uVar5 == (int)lVar15) goto LAB_002cb65b;
  goto LAB_002cb637;
}

Assistant:

DWORD CorUnix::InternalWaitForMultipleObjectsEx(
    CPalThread * pThread,
    DWORD nCount,
    CONST HANDLE *lpHandles,
    BOOL bWaitAll,
    DWORD dwMilliseconds,
    BOOL bAlertable)
{
    DWORD dwRet = WAIT_FAILED;
    PAL_ERROR palErr = NO_ERROR;
    int i, iSignaledObjCount, iSignaledObjIndex = -1;
    bool fWAll = (bool)bWaitAll, fNeedToBlock  = false;
    bool fAbandoned = false;
    WaitType wtWaitType;

    IPalObject            * pIPalObjStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    ISynchWaitController  * pISyncStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    IPalObject           ** ppIPalObjs = pIPalObjStackArray;
    ISynchWaitController ** ppISyncWaitCtrlrs = pISyncStackArray;

    if ((nCount == 0) || (nCount > MAXIMUM_WAIT_OBJECTS))
    {
        ppIPalObjs = NULL;        // make delete at the end safe
        ppISyncWaitCtrlrs = NULL; // make delete at the end safe
        ERROR("Invalid object count=%d [range: 1 to %d]\n",
               nCount, MAXIMUM_WAIT_OBJECTS);
        pThread->SetLastError(ERROR_INVALID_PARAMETER);
        goto WFMOExIntExit;
    }
    else if (nCount == 1)
    {
        fWAll = false;  // makes no difference when nCount is 1
        wtWaitType = SingleObject;
    }
    else
    {
        wtWaitType = fWAll ? MultipleObjectsWaitAll : MultipleObjectsWaitOne;
        if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
        {
            ppIPalObjs = InternalNewArray<IPalObject*>(nCount);
            ppISyncWaitCtrlrs = InternalNewArray<ISynchWaitController*>(nCount);
            if ((NULL == ppIPalObjs) || (NULL == ppISyncWaitCtrlrs))
            {
                ERROR("Out of memory allocating internal structures\n");
                pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto WFMOExIntExit;
            }
        }
    }

    palErr = g_pObjectManager->ReferenceMultipleObjectsByHandleArray(pThread,
                                                                     (VOID **)lpHandles,
                                                                     nCount,
                                                                     &sg_aotWaitObject,
                                                                     SYNCHRONIZE,
                                                                     ppIPalObjs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain object for some or all of the handles [error=%u]\n",
              palErr);
        if (palErr == ERROR_INVALID_HANDLE)
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        else
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntExit;
    }

    if (fWAll)
    {
        // For a wait-all operation, check for duplicate wait objects in the array. This just uses a brute-force O(n^2)
        // algorithm, but since MAXIMUM_WAIT_OBJECTS is small, the worst case is not so bad, and the average case would involve
        // significantly fewer items.
        for (DWORD i = 0; i < nCount - 1; ++i)
        {
            IPalObject *const objectToCheck = ppIPalObjs[i];
            for (DWORD j = i + 1; j < nCount; ++j)
            {
                if (ppIPalObjs[j] == objectToCheck)
                {
                    ERROR("Duplicate handle provided for a wait-all operation [error=%u]\n", ERROR_INVALID_PARAMETER);
                    pThread->SetLastError(ERROR_INVALID_PARAMETER);
                    goto WFMOExIntCleanup;
                }
            }
        }
    }

    palErr = g_pSynchronizationManager->GetSynchWaitControllersForObjects(
        pThread, ppIPalObjs, nCount, ppISyncWaitCtrlrs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain ISynchWaitController interface for some or all "
              "of the objects [error=%u]\n", palErr);
        pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntCleanup;
    }

    if (bAlertable)
    {
        // First check for pending APC. We need to do that while holding the global
        // synch lock implicitely grabbed by GetSynchWaitControllersForObjects
        if (g_pSynchronizationManager->AreAPCsPending(pThread))
        {
            // If there is any pending APC we need to release the
            // implicit global synch lock before calling into it
            for (i = 0; (i < (int)nCount) && (NULL != ppISyncWaitCtrlrs[i]); i++)
            {
                ppISyncWaitCtrlrs[i]->ReleaseController();
                ppISyncWaitCtrlrs[i] = NULL;
            }
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);
            if (NO_ERROR == palErr)
            {
                dwRet = WAIT_IO_COMPLETION;
            }
            else
            {
                ASSERT("Awakened for APC, but no APC is pending\n");
                pThread->SetLastError(ERROR_INTERNAL_ERROR);
                dwRet = WAIT_FAILED;
            }
            goto WFMOExIntCleanup;
        }
    }

    iSignaledObjCount = 0;
    iSignaledObjIndex = -1;
    for (i=0;i<(int)nCount;i++)
    {
        bool fValue;
        palErr = ppISyncWaitCtrlrs[i]->CanThreadWaitWithoutBlocking(&fValue, &fAbandoned);
        if (NO_ERROR != palErr)
        {
            ERROR("ISynchWaitController::CanThreadWaitWithoutBlocking() failed for "
                  "%d-th object [handle=%p error=%u]\n", i, lpHandles[i], palErr);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            goto WFMOExIntReleaseControllers;
        }
        if (fValue)
        {
            iSignaledObjCount++;
            iSignaledObjIndex = i;
            if (!fWAll)
                break;
        }
    }

    fNeedToBlock = (iSignaledObjCount == 0) || (fWAll && (iSignaledObjCount < (int)nCount));
    if (!fNeedToBlock)
    {
        // At least one object signaled, or bWaitAll==TRUE and all object signaled.
        // No need to wait, let's unsignal the object(s) and return without blocking
        int iStartIdx, iEndIdx;

        if (fWAll)
        {
            iStartIdx = 0;
            iEndIdx = nCount;
        }
        else
        {
            iStartIdx = iSignaledObjIndex;
            iEndIdx = iStartIdx + 1;
        }

        // Unsignal objects
        if( iStartIdx < 0 )
        {
            ERROR("Buffer underflow due to iStartIdx < 0");
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        for (i = iStartIdx; i < iEndIdx; i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->ReleaseWaitingThreadWithoutBlocking();
            if (NO_ERROR != palErr)
            {
                ERROR("ReleaseWaitingThreadWithoutBlocking() failed for %d-th "
                      "object [handle=%p error=%u]\n",
                      i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }

        dwRet = (fAbandoned ? WAIT_ABANDONED_0 : WAIT_OBJECT_0);
    }
    else if (0 == dwMilliseconds)
    {
        // Not enough objects signaled, but timeout is zero: no actual wait
        dwRet = WAIT_TIMEOUT;
        fNeedToBlock = false;
    }
    else
    {
        // Register the thread for waiting on all objects
        for (i=0;i<(int)nCount;i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->RegisterWaitingThread(
                                                        wtWaitType,
                                                        i,
                                                        (TRUE == bAlertable));
            if (NO_ERROR != palErr)
            {
                ERROR("RegisterWaitingThread() failed for %d-th object "
                      "[handle=%p error=%u]\n", i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }
    }

WFMOExIntReleaseControllers:
    // Release all controllers before going to sleep
    for (i = 0; i < (int)nCount; i++)
    {
        ppISyncWaitCtrlrs[i]->ReleaseController();
        ppISyncWaitCtrlrs[i] = NULL;
    }
    if (NO_ERROR != palErr)
        goto WFMOExIntCleanup;

    if (fNeedToBlock)
    {
        ThreadWakeupReason twrWakeupReason;

        //
        // Going to sleep
        //
        palErr = g_pSynchronizationManager->BlockThread(pThread,
                                                        dwMilliseconds,
                                                        (TRUE == bAlertable),
                                                        false,
                                                        &twrWakeupReason,
                                                        (DWORD *)&iSignaledObjIndex);
        //
        // Awakened
        //
        if (NO_ERROR != palErr)
        {
            ERROR("IPalSynchronizationManager::BlockThread failed for thread "
                  "pThread=%p [error=%u]\n", pThread, palErr);
            pThread->SetLastError(palErr);
            goto WFMOExIntCleanup;
        }
        switch (twrWakeupReason)
        {
        case WaitSucceeded:
            dwRet = WAIT_OBJECT_0; // offset added later
            break;
        case MutexAbondoned:
            dwRet =  WAIT_ABANDONED_0; // offset added later
            break;
        case WaitTimeout:
            dwRet = WAIT_TIMEOUT;
            break;
        case Alerted:
            _ASSERT_MSG(bAlertable,
                        "Awakened for APC from a non-alertable wait\n");

            dwRet = WAIT_IO_COMPLETION;
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);

            _ASSERT_MSG(NO_ERROR == palErr,
                        "Awakened for APC, but no APC is pending\n");
            break;
        case WaitFailed:
        default:
            ERROR("Thread %p awakened with some failure\n", pThread);
            dwRet = WAIT_FAILED;
            break;
        }
    }

    if (!fWAll && ((WAIT_OBJECT_0 == dwRet) || (WAIT_ABANDONED_0 == dwRet)))
    {
        _ASSERT_MSG(0 <= iSignaledObjIndex,
                    "Failed to identify signaled/abandoned object\n");
        _ASSERT_MSG(iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex),
                    "SignaledObjIndex object out of range "
                    "[index=%d obj_count=%u\n",
                    iSignaledObjCount, nCount);

        if (iSignaledObjIndex < 0)
        {
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        dwRet += iSignaledObjIndex;
    }

WFMOExIntCleanup:
    for (i = 0; i < (int)nCount; i++)
    {
        ppIPalObjs[i]->ReleaseReference(pThread);
        ppIPalObjs[i] = NULL;
    }

WFMOExIntExit:
    if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
    {
        InternalDeleteArray(ppIPalObjs);
        InternalDeleteArray(ppISyncWaitCtrlrs);
    }

    return dwRet;
}